

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::RuntimeCharSet<char16_t>::Print(RuntimeCharSet<char16_t> *this,DebugWriter *w)

{
  uint uVar1;
  bool bVar2;
  Char c;
  uint i;
  uint k;
  uint uVar3;
  uint uVar4;
  
  DebugWriter::Print(w,L"[");
  uVar3 = 0xffffffff;
  k = 0;
  do {
    c = (Char)k;
    uVar1 = uVar3;
    if (k < 0x100) {
      if (((this->direct).vec[k >> 5] >> (k & 0x1f) & 1) != 0) goto LAB_00e5dfd6;
LAB_00e5dfe6:
      if ((-1 < (int)uVar3) && (uVar1 = 0xffffffff, uVar3 + 1 < k)) {
        if (uVar3 + 2 < k) {
          DebugWriter::Print(w,L"-");
        }
        c = c + L'\xffff';
        uVar4 = 0xffffffff;
        goto LAB_00e5e01e;
      }
    }
    else {
      if ((this->root == (CharSetNode *)0x0) || (bVar2 = Get_helper(this,k), !bVar2))
      goto LAB_00e5dfe6;
LAB_00e5dfd6:
      uVar4 = k;
      if ((int)uVar3 < 0) {
LAB_00e5e01e:
        DebugWriter::PrintEscapedChar(w,c);
        uVar1 = uVar4;
      }
    }
    uVar3 = uVar1;
    k = k + 1;
    if (k == 0x10000) {
      if (-1 < (int)uVar3) {
        if (uVar3 < 0xfffe) {
          DebugWriter::Print(w,L"-");
        }
        DebugWriter::PrintEscapedChar(w,L'\xffff');
      }
      DebugWriter::Print(w,L"]");
      return;
    }
  } while( true );
}

Assistant:

void RuntimeCharSet<char16>::Print(DebugWriter* w) const
    {
        w->Print(_u("["));
        int start = -1;
        for (uint i = 0; i < NumChars; i++)
        {
            if (Get(UTC(i)))
            {
                if (start < 0)
                {
                    start = i;
                    w->PrintEscapedChar(UTC(i));
                }
            }
            else
            {
                if (start >= 0)
                {
                    if (i > (uint)(start + 1))
                    {
                        if (i  > (uint)(start + 2))
                            w->Print(_u("-"));
                        w->PrintEscapedChar(UTC(i - 1));
                    }
                    start = -1;
                }
            }
        }
        if (start >= 0)
        {
            if ((uint)start < MaxUChar - 1)
                w->Print(_u("-"));
            w->PrintEscapedChar(MaxChar);
        }
        w->Print(_u("]"));
    }